

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PosTagger.hpp
# Opt level: O1

char * __thiscall cppjieba::PosTagger::SpecialRule(PosTagger *this,RuneStrArray *unicode)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  RuneStr *pRVar7;
  ulong uVar8;
  
  uVar2 = unicode->size_;
  if (uVar2 < 2) {
    uVar5 = 0;
    uVar3 = 0;
  }
  else {
    pRVar7 = unicode->ptr_;
    uVar8 = 1;
    uVar3 = 0;
    uVar5 = 0;
    do {
      uVar1 = pRVar7->rune;
      if ((uVar1 < 0x80) && (uVar3 = uVar3 + 1, 0x2f < uVar1)) {
        uVar5 = uVar5 + (uVar1 < 0x3a);
      }
      if (uVar2 <= uVar8) break;
      uVar8 = uVar8 + 1;
      pRVar7 = pRVar7 + 1;
    } while (uVar3 < uVar2 >> 1);
  }
  pcVar6 = "eng";
  if (uVar5 == uVar3) {
    pcVar6 = "m";
  }
  pcVar4 = "x";
  if (uVar3 != 0) {
    pcVar4 = pcVar6;
  }
  return pcVar4;
}

Assistant:

const char* SpecialRule(const RuneStrArray& unicode) const {
    size_t m = 0;
    size_t eng = 0;
    for (size_t i = 0; i < unicode.size() && eng < unicode.size() / 2; i++) {
      if (unicode[i].rune < 0x80) {
        eng ++;
        if ('0' <= unicode[i].rune && unicode[i].rune <= '9') {
          m++;
        }
      }
    }
    // ascii char is not found
    if (eng == 0) {
      return POS_X;
    }
    // all the ascii is number char
    if (m == eng) {
      return POS_M;
    }
    // the ascii chars contain english letter
    return POS_ENG;
  }